

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O2

int __thiscall Imf_3_4::Zip::compress(Zip *this,char *raw,int rawSize,char *compressed)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  BaseExc *this_00;
  char cVar5;
  char *pcVar6;
  long lVar7;
  size_t outSize;
  
  pcVar6 = this->_tmpBuffer;
  lVar7 = (long)rawSize;
  pcVar1 = raw + lVar7;
  for (; raw < pcVar1; raw = raw + 2) {
    *pcVar6 = *raw;
    if (pcVar1 <= raw + 1) break;
    pcVar6[(rawSize + 1) / 2] = raw[1];
    pcVar6 = pcVar6 + 1;
  }
  pcVar6 = this->_tmpBuffer;
  pcVar1 = pcVar6 + lVar7;
  cVar5 = *pcVar6;
  while (pcVar6 = pcVar6 + 1, pcVar6 < pcVar1) {
    cVar2 = *pcVar6;
    *pcVar6 = (cVar2 - cVar5) + -0x80;
    cVar5 = cVar2;
  }
  iVar3 = this->_zipLevel;
  pcVar1 = this->_tmpBuffer;
  sVar4 = maxCompressedSize(this);
  iVar3 = exr_compress_buffer(0,iVar3,pcVar1,lVar7,compressed,sVar4,&outSize);
  if (iVar3 == 0) {
    return (int)outSize;
  }
  this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::BaseExc::BaseExc(this_00,"Data compression failed.");
  __cxa_throw(this_00,&Iex_3_4::BaseExc::typeinfo,Iex_3_4::BaseExc::~BaseExc);
}

Assistant:

int
Zip::compress (const char* raw, int rawSize, char* compressed)
{
    //
    // Reorder the pixel data.
    //

    {
        char*       t1   = _tmpBuffer;
        char*       t2   = _tmpBuffer + (rawSize + 1) / 2;
        const char* stop = raw + rawSize;

        while (true)
        {
            if (raw < stop)
                *(t1++) = *(raw++);
            else
                break;

            if (raw < stop)
                *(t2++) = *(raw++);
            else
                break;
        }
    }

    //
    // Predictor.
    //

    {
        unsigned char* t    = (unsigned char*) _tmpBuffer + 1;
        unsigned char* stop = (unsigned char*) _tmpBuffer + rawSize;
        int            p    = t[-1];

        while (t < stop)
        {
            int d = int (t[0]) - p + (128 + 256);
            p     = t[0];
            t[0]  = d;
            ++t;
        }
    }

    //
    // Compress the data using zlib
    //
    size_t outSize;
    if (EXR_ERR_SUCCESS != exr_compress_buffer (
                               nullptr,
                               _zipLevel,
                               _tmpBuffer,
                               rawSize,
                               compressed,
                               maxCompressedSize (),
                               &outSize))
    {
        throw IEX_NAMESPACE::BaseExc ("Data compression failed.");
    }

    return outSize;
}